

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall imrt::Station::getOpen(Station *this,int beam)

{
  bool bVar1;
  long in_RSI;
  Station *in_RDI;
  int i;
  vector<int,_std::allocator<int>_> *open;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  Station *this_00;
  undefined4 local_1c;
  
  this_00 = in_RDI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x136ff3);
  for (local_1c = 0; local_1c < *(int *)(in_RSI + 0x40); local_1c = local_1c + 1) {
    bVar1 = isOpenBeamlet(in_RDI,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
    in_stack_ffffffffffffffb4 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffb4);
    if (bVar1) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)this_00,(value_type_conflict2 *)in_RDI);
    }
  }
  return (vector<int,_std::allocator<int>_> *)this_00;
}

Assistant:

vector<int> Station::getOpen(int beam){
    vector<int> open;
    for (int i =0;i<max_apertures;i++){
      if (isOpenBeamlet(beam,i)) open.push_back(i);
    }
    return(open);
  }